

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_setconsttable(HSQUIRRELVM v)

{
  SQRESULT SVar1;
  undefined1 local_28 [8];
  SQObjectPtr o;
  HSQUIRRELVM v_local;
  
  o.super_SQObject._unVal = (SQObjectValue)v;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_28,&v->_sharedstate->_consts);
  SVar1 = sq_setconsttable((HSQUIRRELVM)o.super_SQObject._unVal.pTable);
  if (SVar1 < 0) {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    SQVM::Push(o.super_SQObject._unVal.pThread,(SQObjectPtr *)local_28);
    v_local = (HSQUIRRELVM)0x1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_28);
  return (SQInteger)v_local;
}

Assistant:

static SQInteger base_setconsttable(HSQUIRRELVM v)
{
    SQObjectPtr o = _ss(v)->_consts;
    if(SQ_FAILED(sq_setconsttable(v))) return SQ_ERROR;
    v->Push(o);
    return 1;
}